

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# api.c
# Opt level: O1

int yaml_check_utf8(yaml_char_t *start,size_t length)

{
  byte bVar1;
  bool bVar2;
  uint uVar3;
  uint uVar4;
  byte *pbVar5;
  uint uVar6;
  ulong uVar7;
  
  pbVar5 = start + length;
  do {
    if (pbVar5 <= start) {
      return 1;
    }
    bVar1 = *start;
    uVar4 = (uint)bVar1;
    uVar6 = 1;
    uVar3 = (uint)bVar1;
    if ((((char)bVar1 < '\0') && (uVar6 = 2, (bVar1 & 0xe0) != 0xc0)) &&
       (uVar6 = 3, (bVar1 & 0xf0) != 0xe0)) {
      uVar6 = (uint)((uVar3 & 0xfffffff8) == 0xf0) << 2;
    }
    if ((char)bVar1 < '\0') {
      if ((uVar3 & 0xffffffe0) == 0xc0) {
        uVar4 = uVar3 & 0x1f;
      }
      else if ((bVar1 & 0xf0) == 0xe0) {
        uVar4 = uVar3 & 0xf;
      }
      else {
        uVar4 = uVar3 & 7;
        if ((bVar1 & 0xf8) != 0xf0) {
          uVar4 = 0;
        }
      }
    }
    if (uVar6 == 0) {
LAB_00103ab2:
      bVar2 = false;
    }
    else {
      if (pbVar5 < start + uVar6) goto LAB_00103ab2;
      if (uVar6 != 1) {
        uVar7 = 1;
        do {
          if ((start[uVar7] & 0xffffffc0) != 0x80) goto LAB_00103ab2;
          uVar4 = uVar4 << 6 | start[uVar7] & 0x3f;
          uVar7 = uVar7 + 1;
        } while (uVar6 != uVar7);
      }
      if ((((uVar6 == 1) || ((uVar6 == 2 && (0x7f < uVar4)))) || ((uVar6 == 3 && (0x7ff < uVar4))))
         || ((bVar2 = false, uVar6 == 4 && (0xffff < uVar4)))) {
        bVar2 = true;
        start = start + uVar6;
      }
    }
    if (!bVar2) {
      return 0;
    }
  } while( true );
}

Assistant:

static int
yaml_check_utf8(yaml_char_t *start, size_t length)
{
    yaml_char_t *end = start+length;
    yaml_char_t *pointer = start;

    while (pointer < end) {
        unsigned char octet;
        unsigned int width;
        unsigned int value;
        size_t k;

        octet = pointer[0];
        width = (octet & 0x80) == 0x00 ? 1 :
                (octet & 0xE0) == 0xC0 ? 2 :
                (octet & 0xF0) == 0xE0 ? 3 :
                (octet & 0xF8) == 0xF0 ? 4 : 0;
        value = (octet & 0x80) == 0x00 ? octet & 0x7F :
                (octet & 0xE0) == 0xC0 ? octet & 0x1F :
                (octet & 0xF0) == 0xE0 ? octet & 0x0F :
                (octet & 0xF8) == 0xF0 ? octet & 0x07 : 0;
        if (!width) return 0;
        if (pointer+width > end) return 0;
        for (k = 1; k < width; k ++) {
            octet = pointer[k];
            if ((octet & 0xC0) != 0x80) return 0;
            value = (value << 6) + (octet & 0x3F);
        }
        if (!((width == 1) ||
            (width == 2 && value >= 0x80) ||
            (width == 3 && value >= 0x800) ||
            (width == 4 && value >= 0x10000))) return 0;

        pointer += width;
    }

    return 1;
}